

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkPrintCex(Wlc_Ntk_t *p,Wlc_Ntk_t *pAbs,Abc_Cex_t *pCex)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Wlc_Obj_t *pWVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int i;
  
  if (pCex != (Abc_Cex_t *)0x0) {
    uVar5 = pCex->nRegs;
    for (iVar6 = 0; iVar6 <= pCex->iFrame; iVar6 = iVar6 + 1) {
      printf("Frame%02d ");
      for (i = 0; i < (pAbs->vPis).nSize; i = i + 1) {
        pWVar4 = Wlc_NtkPi(pAbs,i);
        uVar7 = 0;
        printf("PI%d:");
        while( true ) {
          uVar1 = uVar7 + uVar5;
          uVar3 = pWVar4->End - pWVar4->Beg;
          uVar2 = -uVar3;
          if (0 < (int)uVar3) {
            uVar2 = uVar3;
          }
          if (uVar2 < uVar7) break;
          printf("%d",(ulong)(((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0));
          uVar7 = uVar7 + 1;
        }
        putchar(0x20);
        uVar5 = uVar1;
      }
      printf("FF:");
      for (; (int)uVar5 < pCex->nPis; uVar5 = uVar5 + 1) {
        printf("%d",(ulong)(((uint)(&pCex[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0));
      }
      putchar(10);
    }
    return;
  }
  puts("The CEX is NULL.");
  return;
}

Assistant:

void Wlc_NtkPrintCex( Wlc_Ntk_t * p, Wlc_Ntk_t * pAbs, Abc_Cex_t * pCex )
{
    Wlc_Obj_t * pObj; int i, k, f, nBits = pCex ? pCex->nRegs : 0;
    if ( pCex == NULL )
    {
        printf( "The CEX is NULL.\n" );
        return;
    }
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        printf( "Frame%02d ", f );
        Wlc_NtkForEachPi( pAbs, pObj, i )
        {
            printf( "PI%d:", i );
            //printf( "%d(%d):", nBits, Wlc_ObjRange(pObj) );
            for ( k = 0; k < Wlc_ObjRange(pObj); k++ )
                printf( "%d", Abc_InfoHasBit(pCex->pData,  nBits++) );
            printf( " " );
        }
        printf( "FF:" );
        for ( k = 0; nBits < pCex->nPis; k++ )
            printf( "%d", Abc_InfoHasBit(pCex->pData, nBits++) );
        printf( "\n" );
    }

}